

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O3

int __thiscall Fl_Tree_Item::swap_children(Fl_Tree_Item *this,Fl_Tree_Item *a,Fl_Tree_Item *b)

{
  Fl_Tree_Item *pFVar1;
  Fl_Tree_Item **ppFVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  uVar3 = (ulong)(this->_children)._total;
  if ((long)uVar3 < 1) {
    return -1;
  }
  uVar4 = 0xffffffff;
  uVar7 = 0;
  iVar5 = -1;
  do {
    pFVar1 = (this->_children)._items[uVar7];
    iVar6 = (int)uVar7;
    if (pFVar1 == a) {
      iVar5 = iVar6;
      iVar6 = (int)uVar4;
      if ((int)uVar4 != -1) break;
      uVar4 = 0xffffffff;
    }
    else if (pFVar1 == b) {
      if (iVar5 != -1) break;
      uVar4 = uVar7 & 0xffffffff;
      iVar5 = -1;
    }
    iVar6 = (int)uVar4;
    uVar7 = uVar7 + 1;
  } while (uVar3 != uVar7);
  if (iVar6 != -1 && iVar5 != -1) {
    ppFVar2 = (this->_children)._items;
    pFVar1 = ppFVar2[iVar5];
    ppFVar2[iVar5] = ppFVar2[iVar6];
    (this->_children)._items[iVar6] = pFVar1;
    return 0;
  }
  return -1;
}

Assistant:

int Fl_Tree_Item::swap_children(Fl_Tree_Item *a, Fl_Tree_Item *b) {
  int ax = -1, bx = -1;
  for ( int t=0; t<children(); t++ ) {	// find index for a and b
    if ( _children[t] == a ) { ax = t; if ( bx != -1 ) break; else continue; }
    if ( _children[t] == b ) { bx = t; if ( ax != -1 ) break; else continue; }
  }
  if ( ax == -1 || bx == -1 ) return(-1);	// not found? fail
  swap_children(ax,bx);
  return(0);
}